

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsObject.c
# Opt level: O2

void JsStandardHasProperty(JsObject *self,char *prop,JsValue *res)

{
  undefined8 *puVar1;
  JsObject *pJVar2;
  int iVar3;
  int iVar4;
  undefined8 *puVar5;
  int pos;
  
  res->type = JS_BOOLEAN;
  puVar1 = (undefined8 *)*self->sb;
  JsLockup((JsLock)puVar1[2]);
  iVar3 = JsListSize((void *)*puVar1);
  pos = 0;
  if (iVar3 < 1) {
    iVar3 = pos;
  }
  do {
    if (iVar3 == pos) {
      JsUnlock((JsLock)puVar1[2]);
      pJVar2 = self->Prototype;
      if (pJVar2 == (JsObject *)0x0) {
        (res->u).boolean = 0;
        return;
      }
      (*pJVar2->HasProperty)(pJVar2,prop,res);
      return;
    }
    puVar5 = (undefined8 *)JsListGet((void *)*puVar1,pos);
    iVar4 = strcmp((char *)*puVar5,prop);
    pos = pos + 1;
  } while (iVar4 != 0);
  JsUnlock((JsLock)puVar1[2]);
  (res->u).boolean = 1;
  return;
}

Assistant:

void JsStandardHasProperty(struct JsObject *self, char *prop,struct JsValue* res){
	int i,size;
	struct JsProperty* p;
	struct JsStandardSelfBlock* sb;
	res->type = JS_BOOLEAN;
	sb = (struct JsStandardSelfBlock*)self->sb[JS_STANDARD_OBJECT_FLOOR];
	JsLockup(sb->lock);
	size = JsListSize(sb->propertys);
	for(i=0;i<size;++i){
		p = (struct JsProperty*)JsListGet(sb->propertys,i);
		if(strcmp(p->name,prop) == 0){
			JsUnlock(sb->lock);
			res->u.boolean = TRUE;
			return;
		}
	}
	JsUnlock(sb->lock);
	if(!self->Prototype){
		res->u.boolean = FALSE;
		return;
	}
	return ((*self->Prototype->HasProperty)(self->Prototype,prop,res));
}